

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O0

void inner_update_pistol_state_and_predict(update_data *d,float x,float *wref)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  float fVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  float tmp;
  float squared_theta;
  float fabs_x;
  float *w;
  
  dVar6 = std::fabs((double)(ulong)(uint)in_XMM0_Da);
  fVar4 = SUB84(dVar6,0);
  if (in_RSI[3] <= fVar4 && fVar4 != in_RSI[3]) {
    in_RSI[3] = fVar4;
  }
  fVar4 = in_RSI[1];
  fVar1 = in_RSI[1];
  fVar5 = 1.0 / (*(float *)(in_RDI + 4) * in_RSI[3] * (in_RSI[2] + in_RSI[3]));
  dVar6 = std::sqrt((double)(ulong)(uint)in_RSI[2]);
  fVar2 = *(float *)(in_RDI + 8);
  fVar3 = in_RSI[1];
  dVar7 = std::exp((double)(ulong)(uint)(((fVar4 * fVar1) / 2.0) * fVar5));
  *in_RSI = SUB84(dVar6,0) * fVar2 * fVar3 * SUB84(dVar7,0) * fVar5;
  *(float *)(in_RDI + 0x14) = *in_RSI * in_XMM0_Da + *(float *)(in_RDI + 0x14);
  return;
}

Assistant:

void inner_update_pistol_state_and_predict(update_data& d, float x, float& wref)
{
  float* w = &wref;

  float fabs_x = fabs(x);
  if (fabs_x > w[W_MX])
    w[W_MX] = fabs_x;

  float squared_theta = w[W_ZT] * w[W_ZT];
  float tmp = 1.f / (d.ftrl_alpha * w[W_MX] * (w[W_G2] + w[W_MX]));
  w[W_XT] = sqrt(w[W_G2]) * d.ftrl_beta * w[W_ZT] * correctedExp(squared_theta / 2 * tmp) * tmp;

  d.predict += w[W_XT] * x;
}